

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

BOOL VIRTUALSetAllocState(UINT nAction,SIZE_T nStartingBit,SIZE_T nNumberOfBits,PCMI pInformation)

{
  PCMI pInformation_local;
  SIZE_T nNumberOfBits_local;
  SIZE_T nStartingBit_local;
  UINT nAction_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (pInformation == (PCMI)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    nStartingBit_local._4_4_ = 0;
  }
  else {
    nStartingBit_local._4_4_ =
         VIRTUALSetPageBits((uint)(nAction == 0x1000),nStartingBit,nNumberOfBits,
                            pInformation->pAllocState);
  }
  return nStartingBit_local._4_4_;
}

Assistant:

static BOOL VIRTUALSetAllocState( UINT nAction, SIZE_T nStartingBit,
                           SIZE_T nNumberOfBits, CONST PCMI pInformation )
{
    TRACE( "VIRTUALSetAllocState( nAction = %d, nStartingBit = %d, "
           "nNumberOfBits = %d, pStateArray = 0x%p )\n",
           nAction, nStartingBit, nNumberOfBits, pInformation );

    if ( !pInformation )
    {
        ERROR( "pInformation was invalid!\n" );
        return FALSE;
    }

    return VIRTUALSetPageBits((MEM_COMMIT == nAction) ? 1 : 0, nStartingBit,
                              nNumberOfBits, pInformation->pAllocState);
}